

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundConstantExpression::Deserialize
          (BoundConstantExpression *this,Deserializer *deserializer)

{
  BoundConstantExpression *this_00;
  Value value;
  Value local_90;
  Value local_50;
  
  Deserializer::ReadProperty<duckdb::Value>(&local_50,deserializer,200,"value");
  this_00 = (BoundConstantExpression *)operator_new(0x98);
  Value::Value(&local_90,&local_50);
  BoundConstantExpression(this_00,&local_90);
  Value::~Value(&local_90);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  Value::~Value(&local_50);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundConstantExpression::Deserialize(Deserializer &deserializer) {
	auto value = deserializer.ReadProperty<Value>(200, "value");
	auto result = duckdb::unique_ptr<BoundConstantExpression>(new BoundConstantExpression(value));
	return std::move(result);
}